

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfCwiseBinaryOp.h
# Opt level: O1

SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
* __thiscall
Eigen::
SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
::operator=(SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
            *this,Matrix<double,__1,_1,_0,__1,_1> *_rhs)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  Index size;
  Index index;
  ulong uVar7;
  long lVar8;
  
  uVar2 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
          .m_rows;
  if (uVar2 == (_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows) {
    uVar7 = uVar2 - ((long)uVar2 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar2) {
      lVar8 = 0;
      do {
        pdVar3 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar4 = pdVar3 + lVar8;
        dVar6 = pdVar4[1];
        pdVar5 = (_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar8;
        dVar1 = pdVar5[1];
        pdVar3 = pdVar3 + lVar8;
        *pdVar3 = *pdVar4 + *pdVar5;
        pdVar3[1] = dVar6 + dVar1;
        lVar8 = lVar8 + 2;
      } while (lVar8 < (long)uVar7);
    }
    if ((long)uVar7 < (long)uVar2) {
      pdVar4 = (this->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar5 = (_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      do {
        pdVar4[uVar7] = pdVar4[uVar7] + pdVar5[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    return this;
  }
  __assert_fail("rows() == rhs.rows() && cols() == rhs.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kharikri[P]Self-Driving-Car-Extended-Kalman-Filters/src/Eigen/src/Core/SelfCwiseBinaryOp.h"
                ,0x88,
                "SelfCwiseBinaryOp<BinOp, Lhs, Rhs> &Eigen::SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, Eigen::Matrix<double, -1, 1>, Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<RhsDerived> &) [BinOp = Eigen::internal::scalar_sum_op<double>, Lhs = Eigen::Matrix<double, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, RhsDerived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

SelfCwiseBinaryOp& operator=(const Rhs& _rhs)
    {
      typename internal::nested<Rhs>::type rhs(_rhs);
      return Base::operator=(rhs);
    }